

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::DispatchCompute
          (DeviceContextGLImpl *this,DispatchComputeAttribs *Attribs)

{
  uint BindSRBMask;
  GLenum err;
  string msg;
  uint local_4c;
  string local_48;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DispatchCompute
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,&this->m_ContextState);
  DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::DvpVerifyCacheRevisions
            (&(this->m_BindInfo).super_CommittedShaderResources);
  BindSRBMask = (uint)((this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask &
                      ((this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask |
                      (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask));
  if (BindSRBMask != 0) {
    BindProgramResources(this,BindSRBMask);
  }
  DvpValidateCommittedShaderResources(this);
  if (((Attribs->ThreadGroupCountX != 0) && (Attribs->ThreadGroupCountY != 0)) &&
     (Attribs->ThreadGroupCountZ != 0)) {
    (*__glewDispatchCompute)
              (Attribs->ThreadGroupCountX,Attribs->ThreadGroupCountY,Attribs->ThreadGroupCountZ);
    local_4c = glGetError();
    if (local_4c != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"DispatchCompute",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x555,(char (*) [27])"glDispatchCompute() failed",
                 (char (*) [17])"\nGL Error Code: ",&local_4c);
      FormatString<char[6]>(&local_48,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DispatchCompute",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x555);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  GLContextState::SetPendingMemoryBarriers
            (&this->m_ContextState,this->m_CommittedResourcesTentativeBarriers);
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  return;
}

Assistant:

void DeviceContextGLImpl::DispatchCompute(const DispatchComputeAttribs& Attribs)
{
    TDeviceContextBase::DispatchCompute(Attribs, 0);

#if GL_ARB_compute_shader
    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask())
    {
        BindProgramResources(BindSRBMask);
    }

#    ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#    endif

    if (Attribs.ThreadGroupCountX > 0 && Attribs.ThreadGroupCountY > 0 && Attribs.ThreadGroupCountZ > 0)
    {
        glDispatchCompute(Attribs.ThreadGroupCountX, Attribs.ThreadGroupCountY, Attribs.ThreadGroupCountZ);
        DEV_CHECK_GL_ERROR("glDispatchCompute() failed");
    }

    PostDraw();
#else
    UNSUPPORTED("Compute shaders are not supported");
#endif
}